

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expression.cpp
# Opt level: O0

bool __thiscall setup::anon_unknown_0::evaluator::eval_factor(evaluator *this,bool lazy)

{
  byte bVar1;
  bool bVar2;
  runtime_error *prVar3;
  byte in_SIL;
  long in_RDI;
  bool result;
  bool in_stack_ffffffffffffffbf;
  evaluator *in_stack_ffffffffffffffc0;
  evaluator *in_stack_ffffffffffffffc8;
  undefined1 in_stack_ffffffffffffffe7;
  undefined6 in_stack_ffffffffffffffe8;
  undefined1 in_stack_ffffffffffffffee;
  bool local_1;
  
  bVar1 = in_SIL & 1;
  if (*(int *)(in_RDI + 0x10) == 4) {
    next(this);
    bVar1 = eval_expression(in_stack_ffffffffffffffc8,
                            SUB81((ulong)in_stack_ffffffffffffffc0 >> 0x38,0),
                            SUB81((ulong)in_stack_ffffffffffffffc0 >> 0x30,0));
    if (*(int *)(in_RDI + 0x10) != 5) {
      prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(prVar3,"expected closing parenthesis");
      __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    next(this);
    local_1 = (bool)(bVar1 & 1);
  }
  else if (*(int *)(in_RDI + 0x10) == 3) {
    next(this);
    bVar2 = eval_factor((evaluator *)
                        CONCAT17(bVar1,CONCAT16(in_stack_ffffffffffffffee,in_stack_ffffffffffffffe8)
                                ),(bool)in_stack_ffffffffffffffe7);
    local_1 = (bool)((bVar2 ^ 0xffU) & 1);
  }
  else {
    if (*(int *)(in_RDI + 0x10) != 6) {
      prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(prVar3,"unexpected token");
      __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    local_1 = eval_identifier(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffbf);
  }
  return local_1;
}

Assistant:

bool eval_factor(bool lazy) {
		if(token == paren_left) {
			next();
			bool result = eval_expression(lazy);
			if(token != paren_right) {
				throw std::runtime_error("expected closing parenthesis");
			}
			next();
			return result;
		} else if(token == op_not) {
			next();
			return !eval_factor(lazy);
		} else if(token == identifier) {
			return eval_identifier(lazy);
		} else {
			throw std::runtime_error("unexpected token");
		}
	}